

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_edit_unfocus(nk_context *ctx)

{
  nk_window *pnVar1;
  nk_window *win;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5a78,"void nk_edit_unfocus(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5a79,"void nk_edit_unfocus(struct nk_context *)");
  }
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    pnVar1 = ctx->current;
    (pnVar1->edit).active = 0;
    (pnVar1->edit).name = 0;
  }
  return;
}

Assistant:

NK_API void
nk_edit_unfocus(struct nk_context *ctx)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;

    win = ctx->current;
    win->edit.active = nk_false;
    win->edit.name = 0;
}